

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O2

void __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::testBody
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *this)

{
  bool bVar1;
  TestName *pTVar2;
  string *psVar3;
  UtestShell *pUVar4;
  TestTerminatorWithoutExceptions local_b0;
  string local_a8;
  ApprovalTestNamer namer;
  string local_80;
  TestName test;
  
  bVar1 = ApprovalTests::SystemUtils::isWindowsOs();
  if (bVar1) {
    namer.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_00164818;
    pTVar2 = ApprovalTests::ApprovalTestNamer::currentTest((TestName *)0x0);
    ApprovalTests::TestName::TestName(&test,pTVar2);
    psVar3 = ApprovalTests::TestName::getFileName_abi_cxx11_(&test);
    std::__cxx11::string::string((string *)&local_80,(string *)psVar3);
    ApprovalTests::StringUtils::toLower(&local_a8,&local_80);
    ApprovalTests::TestName::setFileName(&test,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    ApprovalTests::ApprovalTestNamer::currentTest(&test);
    pUVar4 = UtestShell::getCurrent();
    ApprovalTests::ApprovalTestNamer::getFileName_abi_cxx11_((string *)&local_a8,&namer);
    local_b0.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001678e0;
    (*pUVar4->_vptr_UtestShell[9])
              (pUVar4,local_a8._M_dataplus._M_p,"CppUTestNamerTests",0,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/CppUTest_Tests/namers/CppUTestNamerTests.cpp"
               ,0x35,&local_b0);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_b0);
    std::__cxx11::string::~string((string *)&local_a8);
    ApprovalTests::TestName::~TestName(&test);
  }
  return;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}